

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

int __thiscall zmq::socket_base_t::query_pipes_stats(socket_base_t *this)

{
  int *piVar1;
  size_type sVar2;
  array_t<zmq::pipe_t,_3> *this_00;
  mutex_t *in_RDI;
  bool bVar3;
  pipe_t *unaff_retaddr;
  size_type size;
  size_type i;
  scoped_lock_t lock;
  scoped_lock_t *in_stack_ffffffffffffffd0;
  array_t<zmq::pipe_t,_3> *local_28;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  scoped_lock_t::scoped_lock_t(in_stack_ffffffffffffffd0,in_RDI);
  bVar3 = ((ulong)in_RDI[0x22]._mutex.__data.__list.__prev & 0x10000) != 0;
  if (!bVar3) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    in_stack_fffffffffffffffc = -1;
  }
  scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x205669);
  if (bVar3) {
    sVar2 = array_t<zmq::pipe_t,_3>::size((array_t<zmq::pipe_t,_3> *)0x205688);
    if (sVar2 == 0) {
      piVar1 = __errno_location();
      *piVar1 = 0xb;
      in_stack_fffffffffffffffc = -1;
    }
    else {
      local_28 = (array_t<zmq::pipe_t,_3> *)0x0;
      this_00 = (array_t<zmq::pipe_t,_3> *)
                array_t<zmq::pipe_t,_3>::size((array_t<zmq::pipe_t,_3> *)0x2056bc);
      for (; local_28 != this_00;
          local_28 = (array_t<zmq::pipe_t,_3> *)
                     ((long)&(local_28->_items).
                             super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1)) {
        array_t<zmq::pipe_t,_3>::operator[](this_00,(size_type)in_RDI);
        pipe_t::send_stats_to_peer
                  (unaff_retaddr,
                   (own_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
      in_stack_fffffffffffffffc = 0;
    }
  }
  return in_stack_fffffffffffffffc;
}

Assistant:

int zmq::socket_base_t::query_pipes_stats ()
{
    {
        scoped_lock_t lock (_monitor_sync);
        if (!(_monitor_events & ZMQ_EVENT_PIPES_STATS)) {
            errno = EINVAL;
            return -1;
        }
    }
    if (_pipes.size () == 0) {
        errno = EAGAIN;
        return -1;
    }
    for (pipes_t::size_type i = 0, size = _pipes.size (); i != size; ++i) {
        _pipes[i]->send_stats_to_peer (this);
    }

    return 0;
}